

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CategoricalMapping.pb.h
# Opt level: O0

Int64ToStringMap * __thiscall
CoreML::Specification::CategoricalMapping::mutable_int64tostringmap(CategoricalMapping *this)

{
  bool bVar1;
  Int64ToStringMap *this_00;
  CategoricalMapping *this_local;
  
  bVar1 = has_int64tostringmap(this);
  if (!bVar1) {
    clear_MappingType(this);
    set_has_int64tostringmap(this);
    this_00 = (Int64ToStringMap *)operator_new(0x38);
    Int64ToStringMap::Int64ToStringMap(this_00);
    (this->MappingType_).int64tostringmap_ = this_00;
  }
  return (Int64ToStringMap *)(this->MappingType_).stringtoint64map_;
}

Assistant:

inline ::CoreML::Specification::Int64ToStringMap* CategoricalMapping::mutable_int64tostringmap() {
  if (!has_int64tostringmap()) {
    clear_MappingType();
    set_has_int64tostringmap();
    MappingType_.int64tostringmap_ = new ::CoreML::Specification::Int64ToStringMap;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.CategoricalMapping.int64ToStringMap)
  return MappingType_.int64tostringmap_;
}